

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_usort(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  int iVar1;
  jx9_value *pjVar2;
  code *xCmp;
  jx9_real jVar3;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) {
    jVar3 = 0.0;
    goto LAB_00138917;
  }
  pMap = (jx9_hashmap *)((*apArg)->x).pOther;
  jVar3 = 4.94065645841247e-324;
  if (pMap->nEntry < 2) goto LAB_00138917;
  if (nArg == 1) {
LAB_00138978:
    xCmp = HashmapCmpCallback1;
    pjVar2 = (jx9_value *)0x0;
  }
  else {
    iVar1 = jx9VmIsCallable(apArg[1]->pVm,apArg[1]);
    if (iVar1 == 0) goto LAB_00138978;
    pjVar2 = apArg[1];
    xCmp = HashmapCmpCallback4;
  }
  HashmapMergeSort(pMap,xCmp,pjVar2);
  HashmapSortRehash(pMap);
LAB_00138917:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = jVar3;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_usort(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	/* Make sure we are dealing with a valid hashmap */
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry > 1 ){
		jx9_value *pCallback = 0;
		ProcNodeCmp xCmp;
		xCmp = HashmapCmpCallback4; /* User-defined function as the comparison callback */
		if( nArg > 1 && jx9_value_is_callable(apArg[1]) ){
			/* Point to the desired callback */
			pCallback = apArg[1];
		}else{
			/* Use the default comparison function */
			xCmp = HashmapCmpCallback1;
		}
		/* Do the merge sort */
		HashmapMergeSort(pMap, xCmp, pCallback);
		/* Rehash [Do not maintain index association as requested by the JX9 specification] */
		HashmapSortRehash(pMap);
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}